

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absUtil.c
# Opt level: O3

Vec_Int_t * Gia_VtaConvertFromGla(Gia_Man_t *p,Vec_Int_t *vGla,int nFrames)

{
  uint uVar1;
  uint uVar2;
  Vec_Int_t *p_00;
  int *piVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int Entry;
  int iVar7;
  bool bVar8;
  
  uVar1 = p->nObjs;
  if ((long)vGla->nSize < 1) {
    iVar7 = 0;
  }
  else {
    lVar6 = 0;
    iVar7 = 0;
    do {
      iVar7 = iVar7 + vGla->pArray[lVar6];
      lVar6 = lVar6 + 1;
    } while (vGla->nSize != lVar6);
  }
  iVar5 = 0x1f;
  if (uVar1 - 1 != 0) {
    for (; uVar1 - 1 >> iVar5 == 0; iVar5 = iVar5 + -1) {
    }
  }
  uVar2 = iVar5 + 0x21;
  if (uVar1 < 2) {
    uVar2 = uVar1;
  }
  if (~(-1 << ((byte)uVar2 & 0x1f)) < (int)uVar1) {
    __assert_fail("nObjs <= nObjMask",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absUtil.c"
                  ,0x79,"Vec_Int_t *Gia_VtaConvertFromGla(Gia_Man_t *, Vec_Int_t *, int)");
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  piVar3 = (int *)malloc(4000);
  p_00->pArray = piVar3;
  Vec_IntPush(p_00,nFrames);
  if (-1 < nFrames) {
    Entry = nFrames + 2;
    iVar4 = -1;
    iVar5 = iVar7;
    do {
      Vec_IntPush(p_00,Entry);
      Entry = Entry + iVar5;
      iVar4 = iVar4 + 1;
      iVar5 = iVar5 + iVar7;
    } while (nFrames != iVar4);
    if (nFrames != 0) {
      iVar7 = vGla->nSize;
      iVar5 = 1;
      do {
        iVar4 = 0;
        do {
          if (0 < iVar7) {
            lVar6 = 0;
            do {
              if (vGla->pArray[lVar6] != 0) {
                Vec_IntPush(p_00,iVar4 << ((byte)uVar2 & 0x1f) | (uint)lVar6);
                iVar7 = vGla->nSize;
              }
              lVar6 = lVar6 + 1;
            } while (lVar6 < iVar7);
          }
          iVar4 = iVar4 + 1;
        } while (iVar4 != iVar5);
        bVar8 = iVar5 != nFrames;
        iVar5 = iVar5 + 1;
      } while (bVar8);
    }
  }
  if (-2 < nFrames) {
    if ((int)(nFrames + 1U) < p_00->nSize) {
      if (p_00->pArray[nFrames + 1U] != p_00->nSize) {
        __assert_fail("Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/abs/absUtil.c"
                      ,0x86,"Vec_Int_t *Gia_VtaConvertFromGla(Gia_Man_t *, Vec_Int_t *, int)");
      }
      return p_00;
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Vec_Int_t * Gia_VtaConvertFromGla( Gia_Man_t * p, Vec_Int_t * vGla, int nFrames )
{
    Vec_Int_t * vVta;
    int nObjBits, nObjMask, nObjs = Gia_ManObjNum(p);
    int i, k, j, Entry, Counter, nGlaSize;
    //. get the GLA size
    nGlaSize = Vec_IntSum(vGla);
    // get the bitmask
    nObjBits = Abc_Base2Log(nObjs);
    nObjMask = (1 << Abc_Base2Log(nObjs)) - 1;
    assert( nObjs <= nObjMask );
    // go through objects
    vVta = Vec_IntAlloc( 1000 );
    Vec_IntPush( vVta, nFrames );
    Counter = nFrames + 2;
    for ( i = 0; i <= nFrames; i++, Counter += i * nGlaSize )
        Vec_IntPush( vVta, Counter );
    for ( i = 0; i < nFrames; i++ )
        for ( k = 0; k <= i; k++ )
            Vec_IntForEachEntry( vGla, Entry, j )
                if ( Entry ) 
                    Vec_IntPush( vVta, (k << nObjBits) | j );
    Counter = Vec_IntEntry(vVta, nFrames+1);
    assert( Vec_IntEntry(vVta, nFrames+1) == Vec_IntSize(vVta) );
    return vVta;
}